

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

uint32_t helper1(lzma_coder_conflict9 *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
                uint32_t position)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  bool bVar7;
  uint local_dc;
  uint local_cc;
  uint local_b8;
  uint32_t cur_and_len_price_1;
  uint32_t dist;
  uint32_t i_1;
  uint32_t cur_and_len_price;
  uint32_t rep_len;
  uint32_t price;
  uint32_t short_rep_price;
  uint8_t *buf_back;
  uint32_t local_88;
  uint32_t len_test;
  uint32_t matches_count;
  uint32_t len_main;
  uint32_t nice_len;
  uint32_t normal_match_price;
  uint32_t len;
  uint32_t len_end;
  uint32_t rep_match_price;
  uint32_t match_price;
  uint32_t pos_state;
  uint8_t match_byte;
  uint uStack_5c;
  uint8_t current_byte;
  uint32_t i;
  uint32_t rep_max_index;
  uint32_t rep_lens [4];
  uint8_t *buf;
  uint32_t buf_avail;
  uint32_t position_local;
  uint32_t *len_res_local;
  uint32_t *back_res_local;
  lzma_mf *mf_local;
  lzma_coder_conflict9 *coder_local;
  
  uStack_5c = 0;
  matches_count = mf->nice_len;
  if (mf->read_ahead == 0) {
    len_test = lzma_mf_find(mf,&local_88,coder->matches);
  }
  else {
    if (mf->read_ahead != 1) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x136,
                    "uint32_t helper1(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    len_test = coder->longest_match_length;
    local_88 = coder->matches_count;
  }
  uVar1 = mf_avail(mf);
  if (uVar1 + 1 < 0x111) {
    uVar1 = mf_avail(mf);
    local_b8 = uVar1 + 1;
  }
  else {
    local_b8 = 0x111;
  }
  if (local_b8 < 2) {
    *back_res = 0xffffffff;
    *len_res = 1;
    coder_local._4_4_ = 0xffffffff;
  }
  else {
    puVar5 = mf_ptr(mf);
    pbVar6 = puVar5 + -1;
    for (pos_state = 0; pos_state < 4; pos_state = pos_state + 1) {
      if (*(short *)pbVar6 == *(short *)(pbVar6 + (-1 - (ulong)coder->reps[pos_state]))) {
        buf_back._4_4_ = 2;
        while( true ) {
          bVar7 = false;
          if (buf_back._4_4_ < local_b8) {
            bVar7 = pbVar6[buf_back._4_4_] ==
                    (pbVar6 + (-1 - (ulong)coder->reps[pos_state]))[buf_back._4_4_];
          }
          if (!bVar7) break;
          buf_back._4_4_ = buf_back._4_4_ + 1;
        }
        (&i)[pos_state] = buf_back._4_4_;
        if ((&i)[uStack_5c] < buf_back._4_4_) {
          uStack_5c = pos_state;
        }
      }
      else {
        (&i)[pos_state] = 0;
      }
    }
    if ((&i)[uStack_5c] < matches_count) {
      if (len_test < matches_count) {
        match_price._3_1_ = *pbVar6;
        match_price._2_1_ = puVar5[-2 - (ulong)coder->reps[0]];
        if (((len_test < 2) && (match_price._3_1_ != match_price._2_1_)) && ((&i)[uStack_5c] < 2)) {
          *back_res = 0xffffffff;
          *len_res = 1;
          coder_local._4_4_ = 0xffffffff;
        }
        else {
          coder->opts[0].state = coder->state;
          rep_match_price = position & coder->pos_mask;
          uVar1 = rc_bit_0_price(coder->is_match[coder->state][rep_match_price]);
          uVar2 = get_literal_price(coder,position,(uint)puVar5[-2],
                                    (_Bool)((coder->state < STATE_LIT_MATCH ^ 0xffU) & 1),
                                    (uint)match_price._2_1_,(uint)match_price._3_1_);
          coder->opts[1].price = uVar1 + uVar2;
          make_literal(coder->opts + 1);
          uVar2 = rc_bit_1_price(coder->is_match[coder->state][rep_match_price]);
          len_end = uVar2;
          uVar1 = rc_bit_1_price(coder->is_rep[coder->state]);
          uVar2 = uVar2 + uVar1;
          len = uVar2;
          if (match_price._2_1_ == match_price._3_1_) {
            uVar1 = get_short_rep_price(coder,coder->state,rep_match_price);
            if (uVar2 + uVar1 < coder->opts[1].price) {
              coder->opts[1].price = uVar2 + uVar1;
              make_short_rep(coder->opts + 1);
            }
          }
          if ((&i)[uStack_5c] < len_test) {
            local_cc = len_test;
          }
          else {
            local_cc = (&i)[uStack_5c];
          }
          normal_match_price = local_cc;
          if (local_cc < 2) {
            *back_res = coder->opts[1].back_prev;
            *len_res = 1;
            coder_local._4_4_ = 0xffffffff;
          }
          else {
            coder->opts[1].pos_prev = 0;
            for (pos_state = 0; pos_state < 4; pos_state = pos_state + 1) {
              coder->opts[0].backs[pos_state] = coder->reps[pos_state];
            }
            nice_len = local_cc;
            do {
              coder->opts[nice_len].price = 0x40000000;
              nice_len = nice_len - 1;
            } while (1 < nice_len);
            for (pos_state = 0; uVar2 = len_end, uVar1 = len, pos_state < 4;
                pos_state = pos_state + 1) {
              i_1 = (&i)[pos_state];
              if (1 < i_1) {
                uVar2 = get_pure_rep_price(coder,pos_state,coder->state,rep_match_price);
                do {
                  uVar3 = get_len_price(&coder->rep_len_encoder,i_1,rep_match_price);
                  uVar4 = uVar1 + uVar2 + uVar3;
                  if (uVar4 < coder->opts[i_1].price) {
                    coder->opts[i_1].price = uVar4;
                    coder->opts[i_1].pos_prev = 0;
                    coder->opts[i_1].back_prev = pos_state;
                    coder->opts[i_1].prev_1_is_literal = false;
                  }
                  i_1 = i_1 - 1;
                } while (1 < i_1);
              }
            }
            uVar1 = rc_bit_0_price(coder->is_rep[coder->state]);
            len_main = uVar2 + uVar1;
            if (i < 2) {
              local_dc = 2;
            }
            else {
              local_dc = i + 1;
            }
            nice_len = local_dc;
            if (local_dc <= len_test) {
              cur_and_len_price_1 = 0;
              while (coder->matches[cur_and_len_price_1].len < local_dc) {
                cur_and_len_price_1 = cur_and_len_price_1 + 1;
              }
              while( true ) {
                uVar2 = len_main;
                uVar1 = coder->matches[cur_and_len_price_1].dist;
                uVar3 = get_pos_len_price(coder,uVar1,nice_len,rep_match_price);
                if (uVar2 + uVar3 < coder->opts[nice_len].price) {
                  coder->opts[nice_len].price = uVar2 + uVar3;
                  coder->opts[nice_len].pos_prev = 0;
                  coder->opts[nice_len].back_prev = uVar1 + 4;
                  coder->opts[nice_len].prev_1_is_literal = false;
                }
                if ((nice_len == coder->matches[cur_and_len_price_1].len) &&
                   (cur_and_len_price_1 = cur_and_len_price_1 + 1, cur_and_len_price_1 == local_88))
                break;
                nice_len = nice_len + 1;
              }
            }
            coder_local._4_4_ = normal_match_price;
          }
        }
      }
      else {
        *back_res = coder->matches[local_88 - 1].dist + 4;
        *len_res = len_test;
        mf_skip(mf,len_test - 1);
        coder_local._4_4_ = 0xffffffff;
      }
    }
    else {
      *back_res = uStack_5c;
      *len_res = (&i)[uStack_5c];
      mf_skip(mf,*len_res - 1);
      coder_local._4_4_ = 0xffffffff;
    }
  }
  return coder_local._4_4_;
}

Assistant:

static inline uint32_t
helper1(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint32_t *LZMA_RESTRICT back_res, uint32_t *LZMA_RESTRICT len_res,
		uint32_t position)
{
	uint32_t buf_avail;
	const uint8_t *buf;
	uint32_t rep_lens[REP_DISTANCES];
	uint32_t rep_max_index = 0;
	uint32_t i;

	uint8_t current_byte;
	uint8_t match_byte;

	uint32_t pos_state;
	uint32_t match_price;
	uint32_t rep_match_price;
	uint32_t len_end;
	uint32_t len;

	uint32_t normal_match_price;

	const uint32_t nice_len = mf->nice_len;

	uint32_t len_main;
	uint32_t matches_count;

	if (mf->read_ahead == 0) {
		len_main = mf_find(mf, &matches_count, coder->matches);
	} else {
		assert(mf->read_ahead == 1);
		len_main = coder->longest_match_length;
		matches_count = coder->matches_count;
	}

	buf_avail = my_min(mf_avail(mf) + 1, MATCH_LEN_MAX);
	if (buf_avail < 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return UINT32_MAX;
	}

	buf = mf_ptr(mf) - 1;

	for (i = 0; i < REP_DISTANCES; ++i) {
		uint32_t len_test;

		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		if (not_equal_16(buf, buf_back)) {
			rep_lens[i] = 0;
			continue;
		}

		for (len_test = 2; len_test < buf_avail
				&& buf[len_test] == buf_back[len_test];
				++len_test) ;

		rep_lens[i] = len_test;
		if (len_test > rep_lens[rep_max_index])
			rep_max_index = i;
	}

	if (rep_lens[rep_max_index] >= nice_len) {
		*back_res = rep_max_index;
		*len_res = rep_lens[rep_max_index];
		mf_skip(mf, *len_res - 1);
		return UINT32_MAX;
	}


	if (len_main >= nice_len) {
		*back_res = coder->matches[matches_count - 1].dist
				+ REP_DISTANCES;
		*len_res = len_main;
		mf_skip(mf, len_main - 1);
		return UINT32_MAX;
	}

	current_byte = *buf;
	match_byte = *(buf - coder->reps[0] - 1);

	if (len_main < 2 && current_byte != match_byte
			&& rep_lens[rep_max_index] < 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return UINT32_MAX;
	}

	coder->opts[0].state = coder->state;

	pos_state = position & coder->pos_mask;

	coder->opts[1].price = rc_bit_0_price(
				coder->is_match[coder->state][pos_state])
			+ get_literal_price(coder, position, buf[-1],
				!is_literal_state(coder->state),
				match_byte, current_byte);

	make_literal(&coder->opts[1]);

	match_price = rc_bit_1_price(
			coder->is_match[coder->state][pos_state]);
	rep_match_price = match_price
			+ rc_bit_1_price(coder->is_rep[coder->state]);

	if (match_byte == current_byte) {
		const uint32_t short_rep_price = rep_match_price
				+ get_short_rep_price(
					coder, coder->state, pos_state);

		if (short_rep_price < coder->opts[1].price) {
			coder->opts[1].price = short_rep_price;
			make_short_rep(&coder->opts[1]);
		}
	}

	len_end = my_max(len_main, rep_lens[rep_max_index]);

	if (len_end < 2) {
		*back_res = coder->opts[1].back_prev;
		*len_res = 1;
		return UINT32_MAX;
	}

	coder->opts[1].pos_prev = 0;

	for (i = 0; i < REP_DISTANCES; ++i)
		coder->opts[0].backs[i] = coder->reps[i];

	len = len_end;
	do {
		coder->opts[len].price = RC_INFINITY_PRICE;
	} while (--len >= 2);


	for (i = 0; i < REP_DISTANCES; ++i) {
		uint32_t price;

		uint32_t rep_len = rep_lens[i];
		if (rep_len < 2)
			continue;

		price = rep_match_price + get_pure_rep_price(
				coder, i, coder->state, pos_state);

		do {
			const uint32_t cur_and_len_price = price
					+ get_len_price(
						&coder->rep_len_encoder,
						rep_len, pos_state);

			if (cur_and_len_price < coder->opts[rep_len].price) {
				coder->opts[rep_len].price = cur_and_len_price;
				coder->opts[rep_len].pos_prev = 0;
				coder->opts[rep_len].back_prev = i;
				coder->opts[rep_len].prev_1_is_literal = false;
			}
		} while (--rep_len >= 2);
	}


	normal_match_price = match_price
			+ rc_bit_0_price(coder->is_rep[coder->state]);

	len = rep_lens[0] >= 2 ? rep_lens[0] + 1 : 2;
	if (len <= len_main) {
		uint32_t i = 0;
		while (len > coder->matches[i].len)
			++i;

		for(; ; ++len) {
			const uint32_t dist = coder->matches[i].dist;
			const uint32_t cur_and_len_price = normal_match_price
					+ get_pos_len_price(coder,
						dist, len, pos_state);

			if (cur_and_len_price < coder->opts[len].price) {
				coder->opts[len].price = cur_and_len_price;
				coder->opts[len].pos_prev = 0;
				coder->opts[len].back_prev
						= dist + REP_DISTANCES;
				coder->opts[len].prev_1_is_literal = false;
			}

			if (len == coder->matches[i].len)
				if (++i == matches_count)
					break;
		}
	}

	return len_end;
}